

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int checkForBiomesAtLayer
              (LayerStack *g,Layer *entry,int *cache,uint64_t seed,int x,int z,uint w,uint h,
              BiomeFilter *filter)

{
  int iVar1;
  size_t sVar2;
  byte bVar3;
  void *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int in_stack_00000008;
  int in_stack_00000010;
  BiomeFilter *in_stack_00000018;
  int match_req;
  int match_any;
  int match_exc;
  int id;
  uint i_1;
  uint64_t m;
  uint64_t b;
  filter_data_t fd [9];
  int cs4;
  int cs3;
  int cs6;
  int specialcnt;
  uint64_t required;
  uint64_t potential;
  uint64_t cs;
  uint64_t ss;
  int z1;
  int x1;
  int z0;
  int x0;
  int bh;
  int bw;
  int bz;
  int bx;
  int j;
  int i;
  int mem1x1;
  int memsiz;
  int err;
  int ret;
  int *ids;
  Layer *l;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  undefined5 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe95;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 in_stack_fffffffffffffe97;
  ulong in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  uint local_14c;
  ulong local_148;
  ulong local_140;
  filter_data_t local_138;
  filter_data_t fStack_128;
  filter_data_t fStack_118;
  filter_data_t fStack_108;
  filter_data_t fStack_f8;
  filter_data_t fStack_e8;
  filter_data_t fStack_d8;
  filter_data_t fStack_c8;
  filter_data_t fStack_b8;
  int local_a8;
  int local_a4;
  uint local_a0;
  int local_9c;
  ulong local_98;
  ulong local_90;
  uint64_t local_88;
  uint64_t local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  void *local_40;
  long local_38;
  int local_30;
  int local_2c;
  void *local_20;
  undefined8 *local_18;
  long local_10;
  
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((in_stack_00000018->flags & 1) != 0) {
    local_5c = in_R8D * *(int *)((long)in_RSI + 0xc);
    local_60 = in_R9D * *(int *)((long)in_RSI + 0xc);
    local_64 = in_stack_00000008 * *(int *)((long)in_RSI + 0xc);
    local_68 = in_stack_00000010 * *(int *)((long)in_RSI + 0xc);
    local_9c = in_stack_00000018->specialCnt;
    if (0 < local_9c) {
      local_38 = in_RDI + 0x3f0;
      local_6c = local_5c / *(int *)(in_RDI + 0x3fc);
      if (in_R8D < 0) {
        local_6c = local_6c + -1;
      }
      local_70 = local_60 / *(int *)(in_RDI + 0x3fc);
      if (in_R9D < 0) {
        local_70 = local_70 + -1;
      }
      local_74 = (local_5c + local_64) / *(int *)(in_RDI + 0x3fc);
      if (-1 < in_R8D + in_stack_00000008) {
        local_74 = local_74 + 1;
      }
      local_78 = (local_60 + local_68) / *(int *)(in_RDI + 0x3fc);
      if (-1 < in_R9D + in_stack_00000010) {
        local_78 = local_78 + 1;
      }
      local_80 = getStartSeed(CONCAT17(in_stack_fffffffffffffe97,
                                       CONCAT16(in_stack_fffffffffffffe96,
                                                CONCAT15(in_stack_fffffffffffffe95,
                                                         in_stack_fffffffffffffe90))),
                              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      for (local_58 = local_70; local_58 <= local_78; local_58 = local_58 + 1) {
        for (local_54 = local_6c; local_54 <= local_74; local_54 = local_54 + 1) {
          local_88 = getChunkSeed(CONCAT17(in_stack_fffffffffffffe97,
                                           CONCAT16(in_stack_fffffffffffffe96,
                                                    CONCAT15(in_stack_fffffffffffffe95,
                                                             in_stack_fffffffffffffe90))),
                                  in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
          iVar1 = mcFirstIsZero(local_88,0xd);
          if (iVar1 != 0) {
            local_9c = local_9c + -1;
          }
        }
      }
      if (0 < local_9c) {
        return 0;
      }
    }
    local_38 = local_10 + 0x5e8;
    local_6c = local_5c / *(int *)(local_10 + 0x5f4);
    if (local_2c < 0) {
      local_6c = local_6c + -1;
    }
    local_70 = local_60 / *(int *)(local_10 + 0x5f4);
    if (local_30 < 0) {
      local_70 = local_70 + -1;
    }
    local_74 = (local_5c + local_64) / *(int *)(local_10 + 0x5f4);
    if (-1 < local_2c + in_stack_00000008) {
      local_74 = local_74 + 1;
    }
    local_78 = (local_60 + local_68) / *(int *)(local_10 + 0x5f4);
    if (-1 < local_30 + in_stack_00000010) {
      local_78 = local_78 + 1;
    }
    if ((in_stack_00000018->majorToFind & 0x4000) != 0) {
      local_80 = getStartSeed(CONCAT17(in_stack_fffffffffffffe97,
                                       CONCAT16(in_stack_fffffffffffffe96,
                                                CONCAT15(in_stack_fffffffffffffe95,
                                                         in_stack_fffffffffffffe90))),
                              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      local_58 = local_70;
      do {
        if (local_78 < local_58) {
          return 0;
        }
        for (local_54 = local_6c; local_54 <= local_74; local_54 = local_54 + 1) {
          local_88 = getChunkSeed(CONCAT17(in_stack_fffffffffffffe97,
                                           CONCAT16(in_stack_fffffffffffffe96,
                                                    CONCAT15(in_stack_fffffffffffffe95,
                                                             in_stack_fffffffffffffe90))),
                                  in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
          iVar1 = mcFirstIsZero(local_88,100);
          if (iVar1 != 0) goto LAB_00113a00;
        }
        local_58 = local_58 + 1;
      } while( true );
    }
LAB_00113a00:
    local_90 = 0;
    local_98 = in_stack_00000018->majorToFind & 0xc82800005e;
    local_80 = getStartSeed(CONCAT17(in_stack_fffffffffffffe97,
                                     CONCAT16(in_stack_fffffffffffffe96,
                                              CONCAT15(in_stack_fffffffffffffe95,
                                                       in_stack_fffffffffffffe90))),
                            CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    for (local_58 = local_70; local_58 <= local_78; local_58 = local_58 + 1) {
      for (local_54 = local_6c; local_54 <= local_74; local_54 = local_54 + 1) {
        local_88 = getChunkSeed(CONCAT17(in_stack_fffffffffffffe97,
                                         CONCAT16(in_stack_fffffffffffffe96,
                                                  CONCAT15(in_stack_fffffffffffffe95,
                                                           in_stack_fffffffffffffe90))),
                                in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
        local_a0 = mcFirstInt(local_88,6);
        local_a4 = mcFirstInt(local_88,3);
        local_a8 = mcFirstInt(local_88,4);
        if (local_a4 == 0) {
          local_90 = local_90 | 0x4000000000;
        }
        else {
          local_90 = local_90 | 0x8000000000;
        }
        in_stack_fffffffffffffe98 = (ulong)local_a0;
        switch(in_stack_fffffffffffffe98) {
        case 0:
          local_90 = local_90 | 0x14;
          break;
        case 1:
          local_90 = local_90 | 0x20000004;
          break;
        case 2:
          local_90 = local_90 | 0xc;
          break;
        case 3:
          local_90 = local_90 | 0x800000002;
          break;
        case 4:
          local_90 = local_90 | 0x808000000;
          break;
        case 5:
          local_90 = local_90 | 0x42;
        }
        if (local_a8 == 3) {
          local_90 = local_90 | 0x40000000;
        }
        else {
          local_90 = local_90 | 0x1000;
        }
      }
    }
    if ((local_90 & local_98) != local_98) {
      return 0;
    }
  }
  local_38 = local_10;
  if (local_20 == (void *)0x0) {
    sVar2 = getMinLayerCacheSize
                      ((Layer *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       (int)(in_stack_fffffffffffffe98 >> 0x20),(int)in_stack_fffffffffffffe98);
    local_4c = (int)sVar2;
    local_40 = calloc((long)local_4c,4);
  }
  else {
    local_4c = 0;
    local_40 = local_20;
  }
  if ((in_stack_00000018->biomeToExcl != 0 || in_stack_00000018->biomeToExclM != 0) &&
     (1 < (uint)(in_stack_00000008 * in_stack_00000010))) {
    local_48 = 0;
    if (local_4c == 0) {
      sVar2 = getMinLayerCacheSize
                        ((Layer *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         (int)(in_stack_fffffffffffffe98 >> 0x20),(int)in_stack_fffffffffffffe98);
      local_4c = (int)sVar2;
    }
    sVar2 = getMinLayerCacheSize
                      ((Layer *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       (int)(in_stack_fffffffffffffe98 >> 0x20),(int)in_stack_fffffffffffffe98);
    local_50 = (int)sVar2;
    if (local_50 * 2 < local_4c) {
      setLayerSeed((Layer *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe98);
      local_48 = testExclusion((Layer *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8
                                                ),
                               (int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                               (int)(in_stack_fffffffffffffe98 >> 0x20),
                               (int)in_stack_fffffffffffffe98,
                               (BiomeFilter *)
                               CONCAT17(in_stack_fffffffffffffe97,
                                        CONCAT16(in_stack_fffffffffffffe96,
                                                 CONCAT15(in_stack_fffffffffffffe95,
                                                          in_stack_fffffffffffffe90))));
    }
    if (local_50 * 5 < local_4c) {
      if (local_48 == 0) {
        local_48 = testExclusion((Layer *)CONCAT44(in_stack_fffffffffffffeac,
                                                   in_stack_fffffffffffffea8),
                                 (int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                ),(int)(in_stack_fffffffffffffe98 >> 0x20),
                                 (int)in_stack_fffffffffffffe98,
                                 (BiomeFilter *)
                                 CONCAT17(in_stack_fffffffffffffe97,
                                          CONCAT16(in_stack_fffffffffffffe96,
                                                   CONCAT15(in_stack_fffffffffffffe95,
                                                            in_stack_fffffffffffffe90))));
      }
      if (local_48 == 0) {
        local_48 = testExclusion((Layer *)CONCAT44(in_stack_fffffffffffffeac,
                                                   in_stack_fffffffffffffea8),
                                 (int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                ),(int)(in_stack_fffffffffffffe98 >> 0x20),
                                 (int)in_stack_fffffffffffffe98,
                                 (BiomeFilter *)
                                 CONCAT17(in_stack_fffffffffffffe97,
                                          CONCAT16(in_stack_fffffffffffffe96,
                                                   CONCAT15(in_stack_fffffffffffffe95,
                                                            in_stack_fffffffffffffe90))));
      }
      if (local_48 == 0) {
        local_48 = testExclusion((Layer *)CONCAT44(in_stack_fffffffffffffeac,
                                                   in_stack_fffffffffffffea8),
                                 (int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                ),(int)(in_stack_fffffffffffffe98 >> 0x20),
                                 (int)in_stack_fffffffffffffe98,
                                 (BiomeFilter *)
                                 CONCAT17(in_stack_fffffffffffffe97,
                                          CONCAT16(in_stack_fffffffffffffe96,
                                                   CONCAT15(in_stack_fffffffffffffe95,
                                                            in_stack_fffffffffffffe90))));
      }
      if (local_48 == 0) {
        local_48 = testExclusion((Layer *)CONCAT44(in_stack_fffffffffffffeac,
                                                   in_stack_fffffffffffffea8),
                                 (int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                ),(int)(in_stack_fffffffffffffe98 >> 0x20),
                                 (int)in_stack_fffffffffffffe98,
                                 (BiomeFilter *)
                                 CONCAT17(in_stack_fffffffffffffe97,
                                          CONCAT16(in_stack_fffffffffffffe96,
                                                   CONCAT15(in_stack_fffffffffffffe95,
                                                            in_stack_fffffffffffffe90))));
      }
    }
    if (local_48 != 0) {
      if (local_20 == (void *)0x0) {
        free(local_40);
      }
      return 0;
    }
  }
  swapMap(&local_138,in_stack_00000018,(Layer *)(local_38 + 0xf78),mapFilterOceanMix);
  swapMap(&fStack_128,in_stack_00000018,(Layer *)(local_38 + 0xd38),mapFilterRiverMix);
  swapMap(&fStack_118,in_stack_00000018,(Layer *)(local_38 + 0x990),mapFilterShore);
  swapMap(&fStack_108,in_stack_00000018,(Layer *)(local_38 + 0x870),mapFilterRareBiome);
  swapMap(&fStack_f8,in_stack_00000018,(Layer *)(local_38 + 0x708),mapFilterBiomeEdge);
  swapMap(&fStack_e8,in_stack_00000018,(Layer *)(local_38 + 0xd80),mapFilterOceanTemp);
  swapMap(&fStack_d8,in_stack_00000018,(Layer *)(local_38 + 0x5e8),mapFilterBiome);
  swapMap(&fStack_c8,in_stack_00000018,(Layer *)(local_38 + 0x558),mapFilterMushroom);
  swapMap(&fStack_b8,in_stack_00000018,(Layer *)(local_38 + 0x3f0),mapFilterSpecial);
  local_44 = 0;
  setLayerSeed((Layer *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe98);
  local_48 = (*(code *)*local_18)
                       (local_18,local_40,local_2c,local_30,in_stack_00000008,in_stack_00000010);
  if (local_48 == 0) {
    local_140 = 0;
    local_148 = 0;
    for (local_14c = 0; local_14c < (uint)(in_stack_00000008 * in_stack_00000010);
        local_14c = local_14c + 1) {
      iVar1 = *(int *)((long)local_40 + (ulong)local_14c * 4);
      bVar3 = (byte)iVar1;
      if (iVar1 < 0x80) {
        local_140 = 1L << (bVar3 & 0x3f) | local_140;
      }
      else {
        local_148 = 1L << (bVar3 + 0x80 & 0x3f) | local_148;
      }
    }
    bVar4 = true;
    if ((local_140 & in_stack_00000018->biomeToExcl) == 0) {
      bVar4 = (local_148 & in_stack_00000018->biomeToExclM) != 0;
    }
    bVar5 = true;
    if ((local_140 & in_stack_00000018->biomeToPick) == 0) {
      bVar5 = (local_148 & in_stack_00000018->biomeToPickM) != 0;
    }
    bVar6 = false;
    if ((local_140 & in_stack_00000018->biomeToFind) == in_stack_00000018->biomeToFind) {
      bVar6 = (local_148 & in_stack_00000018->biomeToFindM) == in_stack_00000018->biomeToFindM;
    }
    if (((!bVar4 || in_stack_00000018->biomeToExcl == 0 && in_stack_00000018->biomeToExclM == 0) &&
        (bVar5 || in_stack_00000018->biomeToPick == 0 && in_stack_00000018->biomeToPickM == 0)) &&
       (bVar6 || in_stack_00000018->biomeToFind == 0 && in_stack_00000018->biomeToFindM == 0)) {
      local_44 = 1;
    }
  }
  else if (local_48 == 1) {
    local_44 = 0;
  }
  else if (local_48 == 2) {
    local_44 = 2;
  }
  restoreMap(&fStack_b8,(Layer *)(local_38 + 0x3f0));
  restoreMap(&fStack_c8,(Layer *)(local_38 + 0x558));
  restoreMap(&fStack_d8,(Layer *)(local_38 + 0x5e8));
  restoreMap(&fStack_e8,(Layer *)(local_38 + 0xd80));
  restoreMap(&fStack_f8,(Layer *)(local_38 + 0x708));
  restoreMap(&fStack_108,(Layer *)(local_38 + 0x870));
  restoreMap(&fStack_118,(Layer *)(local_38 + 0x990));
  restoreMap(&fStack_128,(Layer *)(local_38 + 0xd38));
  restoreMap(&local_138,(Layer *)(local_38 + 0xf78));
  if (local_20 == (void *)0x0) {
    free(local_40);
  }
  return local_44;
}

Assistant:

int checkForBiomesAtLayer(
        LayerStack        * g,
        Layer             * entry,
        int               * cache,
        uint64_t            seed,
        int                 x,
        int                 z,
        unsigned int        w,
        unsigned int        h,
        const BiomeFilter * filter
        )
{
    Layer *l;
    int *ids;
    int ret, err;
    int memsiz, mem1x1;

    if (filter->flags & BF_APPROX) // TODO: protoCheck for 1.6-
    {
        l = entry;

        int i, j;
        int bx = x * l->scale;
        int bz = z * l->scale;
        int bw = w * l->scale;
        int bh = h * l->scale;
        int x0, z0, x1, z1;
        uint64_t ss, cs;
        uint64_t potential, required;

        int specialcnt = filter->specialCnt;
        if (specialcnt > 0)
        {
            l = &g->layers[L_SPECIAL_1024];
            x0 = (bx) / l->scale; if (x < 0) x0--;
            z0 = (bz) / l->scale; if (z < 0) z0--;
            x1 = (bx + bw) / l->scale; if (x+(int)w >= 0) x1++;
            z1 = (bz + bh) / l->scale; if (z+(int)h >= 0) z1++;
            ss = getStartSeed(seed, l->layerSalt);

            for (j = z0; j <= z1; j++)
            {
                for (i = x0; i <= x1; i++)
                {
                    cs = getChunkSeed(ss, i, j);
                    if (mcFirstIsZero(cs, 13))
                        specialcnt--;
                }
            }
            if (specialcnt > 0)
                return 0;
        }

        l = &g->layers[L_BIOME_256];
        x0 = bx / l->scale; if (x < 0) x0--;
        z0 = bz / l->scale; if (z < 0) z0--;
        x1 = (bx + bw) / l->scale; if (x+(int)w >= 0) x1++;
        z1 = (bz + bh) / l->scale; if (z+(int)h >= 0) z1++;

        if (filter->majorToFind & (1ULL << mushroom_fields))
        {
            ss = getStartSeed(seed, g->layers[L_MUSHROOM_256].layerSalt);

            for (j = z0; j <= z1; j++)
            {
                for (i = x0; i <= x1; i++)
                {
                    cs = getChunkSeed(ss, i, j);
                    if (mcFirstIsZero(cs, 100))
                        goto L_has_proto_mushroom;
                }
            }
            return 0;
        }
L_has_proto_mushroom:

        potential = 0;
        required = filter->majorToFind & (
                (1ULL << badlands_plateau) | (1ULL << wooded_badlands_plateau) |
                (1ULL << desert) | (1ULL << savanna) | (1ULL << plains) |
                (1ULL << forest) | (1ULL << dark_forest) | (1ULL << mountains) |
                (1ULL << birch_forest) | (1ULL << swamp));

        ss = getStartSeed(seed, l->layerSalt);

        for (j = z0; j <= z1; j++)
        {
            for (i = x0; i <= x1; i++)
            {
                cs = getChunkSeed(ss, i, j);
                int cs6 = mcFirstInt(cs, 6);
                int cs3 = mcFirstInt(cs, 3);
                int cs4 = mcFirstInt(cs, 4);

                if (cs3) potential |= (1ULL << badlands_plateau);
                else potential |= (1ULL << wooded_badlands_plateau);

                switch (cs6)
                {
                case 0: potential |= (1ULL << desert) | (1ULL << forest); break;
                case 1: potential |= (1ULL << desert) | (1ULL << dark_forest); break;
                case 2: potential |= (1ULL << desert) | (1ULL << mountains); break;
                case 3: potential |= (1ULL << savanna) | (1ULL << plains); break;
                case 4: potential |= (1ULL << savanna) | (1ULL << birch_forest); break;
                case 5: potential |= (1ULL << plains) | (1ULL << swamp); break;
                }

                if (cs4 == 3) potential |= (1ULL << snowy_taiga);
                else potential |= (1ULL << snowy_tundra);
            }
        }

        if ((potential & required) ^ required)
            return 0;
    }

    l = g->layers;
    if (cache)
    {
        memsiz = 0;
        ids = cache;
    }
    else
    {
        memsiz = getMinLayerCacheSize(entry, w, h);
        ids = (int*) calloc(memsiz, sizeof(int));
    }

    if ((filter->biomeToExcl | filter->biomeToExclM) && w*h > 1)
    {
        err = 0;
        if (memsiz == 0)
            memsiz = getMinLayerCacheSize(entry, w, h);
        mem1x1 = getMinLayerCacheSize(entry, 1, 1);
        if (mem1x1 * 2 < memsiz)
        {
            setLayerSeed(entry, seed);
            err = testExclusion(entry, ids, x+w/2, z+h/2, filter);
        }
        if (mem1x1 * 5 < memsiz)
        {
            if (!err) err = testExclusion(entry, ids, x,     z,     filter);
            if (!err) err = testExclusion(entry, ids, x+w-1, z+h-1, filter);
            if (!err) err = testExclusion(entry, ids, x,     z+h-1, filter);
            if (!err) err = testExclusion(entry, ids, x+w-1, z,     filter);
        }
        if (err)
        {
            if (cache == NULL)
                free(ids);
            return 0;
        }
    }

    filter_data_t fd[9];
    swapMap(fd+0, filter, l+L_OCEAN_MIX_4,    mapFilterOceanMix);
    swapMap(fd+1, filter, l+L_RIVER_MIX_4,    mapFilterRiverMix);
    swapMap(fd+2, filter, l+L_SHORE_16,       mapFilterShore);
    swapMap(fd+3, filter, l+L_SUNFLOWER_64,   mapFilterRareBiome);
    swapMap(fd+4, filter, l+L_BIOME_EDGE_64,  mapFilterBiomeEdge);
    swapMap(fd+5, filter, l+L_OCEAN_TEMP_256, mapFilterOceanTemp);
    swapMap(fd+6, filter, l+L_BIOME_256,      mapFilterBiome);
    swapMap(fd+7, filter, l+L_MUSHROOM_256,   mapFilterMushroom);
    swapMap(fd+8, filter, l+L_SPECIAL_1024,   mapFilterSpecial);

    ret = 0;
    setLayerSeed(entry, seed);
    err = entry->getMap(entry, ids, x, z, w, h);
    if (err == 0)
    {
        uint64_t b = 0, m = 0;
        unsigned int i;
        for (i = 0; i < w*h; i++)
        {
            int id = ids[i];
            if (id < 128) b |= (1ULL << id);
            else m |= (1ULL << (id-128));
        }

        int match_exc = (filter->biomeToExcl|filter->biomeToExclM) == 0;
        int match_any = (filter->biomeToPick|filter->biomeToPickM) == 0;
        int match_req = (filter->biomeToFind|filter->biomeToFindM) == 0;
        match_exc |= ((b & filter->biomeToExcl) || (m & filter->biomeToExclM)) == 0;
        match_any |= ((b & filter->biomeToPick) || (m & filter->biomeToPickM));
        match_req |= ((b & filter->biomeToFind)  == filter->biomeToFind &&
                      (m & filter->biomeToFindM) == filter->biomeToFindM);
        if (match_exc && match_any && match_req)
            ret = 1;
    }
    else if (err == M_STOP)
    {   // biome requirements not met
        ret = 0;
    }
    else if (err == M_DONE)
    {   // exclusion biomes cannot generate
        ret = 2;
    }

    restoreMap(fd+8, l+L_SPECIAL_1024);
    restoreMap(fd+7, l+L_MUSHROOM_256);
    restoreMap(fd+6, l+L_BIOME_256);
    restoreMap(fd+5, l+L_OCEAN_TEMP_256);
    restoreMap(fd+4, l+L_BIOME_EDGE_64);
    restoreMap(fd+3, l+L_SUNFLOWER_64);
    restoreMap(fd+2, l+L_SHORE_16);
    restoreMap(fd+1, l+L_RIVER_MIX_4);
    restoreMap(fd+0, l+L_OCEAN_MIX_4);

    if (cache == NULL)
        free(ids);

    return ret;
}